

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kevent.c
# Opt level: O2

char * kevent_dump(kevent *kev)

{
  char *__s;
  short filt;
  ushort uVar1;
  ulong uVar2;
  uint uVar3;
  char *__s_00;
  char *pcVar4;
  size_t sVar5;
  
  uVar2 = kev->ident;
  __s_00 = (char *)__tls_get_addr(&PTR_0010afd0);
  filt = kev->filter;
  pcVar4 = filter_name(filt);
  snprintf(__s_00 + 0x870,0x40,"%d (%s)",(ulong)(uint)(int)filt,pcVar4);
  pcVar4 = __s_00 + 0x8b0;
  snprintf(pcVar4,0x400,"flags=0x%04x (",(ulong)kev->flags);
  uVar1 = kev->flags;
  if ((uVar1 & 1) != 0) {
    sVar5 = strlen(pcVar4);
    builtin_strncpy(__s_00 + sVar5 + 0x8b0,"EV_ADD ",8);
    uVar1 = kev->flags;
  }
  if ((uVar1 & 4) != 0) {
    sVar5 = strlen(pcVar4);
    builtin_strncpy(__s_00 + sVar5 + 0x8b0,"EV_ENABLE ",0xb);
    uVar1 = kev->flags;
  }
  if ((uVar1 & 8) != 0) {
    sVar5 = strlen(pcVar4);
    builtin_strncpy(__s_00 + sVar5 + 0x8b0,"EV_DISABLE ",0xc);
    uVar1 = kev->flags;
  }
  if ((uVar1 & 2) != 0) {
    sVar5 = strlen(pcVar4);
    builtin_strncpy(__s_00 + sVar5 + 0x8b0,"EV_DELETE ",0xb);
    uVar1 = kev->flags;
  }
  if ((uVar1 & 0x10) != 0) {
    sVar5 = strlen(pcVar4);
    builtin_strncpy(__s_00 + sVar5 + 0x8b0,"EV_ONESHOT ",0xc);
    uVar1 = kev->flags;
  }
  if ((uVar1 & 0x20) != 0) {
    sVar5 = strlen(pcVar4);
    builtin_strncpy(__s_00 + sVar5 + 0x8b0,"EV_CLEAR ",10);
    uVar1 = kev->flags;
  }
  if ((short)uVar1 < 0) {
    sVar5 = strlen(pcVar4);
    builtin_strncpy(__s_00 + sVar5 + 0x8b0,"EV_EOF ",8);
    uVar1 = kev->flags;
  }
  if ((uVar1 >> 0xe & 1) != 0) {
    sVar5 = strlen(pcVar4);
    builtin_strncpy(__s_00 + sVar5 + 0x8b0,"EV_ERROR ",10);
    uVar1 = kev->flags;
  }
  if ((char)uVar1 < '\0') {
    sVar5 = strlen(pcVar4);
    builtin_strncpy(__s_00 + sVar5 + 0x8b0,"EV_DISPATCH ",0xd);
    uVar1 = kev->flags;
  }
  if ((uVar1 & 0x40) != 0) {
    sVar5 = strlen(pcVar4);
    builtin_strncpy(__s_00 + sVar5 + 0x8b0,"EV_RECEIPT ",0xc);
  }
  sVar5 = strlen(pcVar4);
  if (pcVar4[sVar5 - 1] == ' ') {
    __s_00[sVar5 + 0x8af] = '\0';
  }
  sVar5 = strlen(pcVar4);
  (pcVar4 + sVar5)[0] = ')';
  (pcVar4 + sVar5)[1] = '\0';
  __s = __s_00 + 0xcb0;
  snprintf(__s,0x400,"fflags=0x%04x (",(ulong)kev->fflags);
  switch(kev->filter) {
  case -0xc:
    uVar3 = kev->fflags;
    if ((uVar3 & 1) != 0) {
      sVar5 = strlen(__s);
      builtin_strncpy(__s_00 + sVar5 + 0xcb0,"NOTE_VERSION ",0xe);
      uVar3 = kev->fflags;
    }
    if ((uVar3 & 2) != 0) {
      sVar5 = strlen(__s);
      builtin_strncpy(__s_00 + sVar5 + 0xcb0,"NOTE_VERSION_STR ",0x12);
      uVar3 = kev->fflags;
    }
    if ((uVar3 & 3) != 0) {
      sVar5 = strlen(__s);
      builtin_strncpy(__s_00 + sVar5 + 0xcb0,"NOTE_THREAD_SAFE ",0x12);
      uVar3 = kev->fflags;
    }
    if ((uVar3 & 4) != 0) {
      sVar5 = strlen(__s);
      builtin_strncpy(__s_00 + sVar5 + 0xcb0,"NOTE_FORK_CLEANUP ",0x13);
    }
    break;
  case -0xb:
    uVar3 = kev->fflags;
    if ((uVar3 >> 0x1e & 1) != 0) {
      sVar5 = strlen(__s);
      builtin_strncpy(__s_00 + sVar5 + 0xcb0,"NOTE_FFAND ",0xc);
      uVar3 = kev->fflags;
    }
    if ((int)uVar3 < 0) {
      sVar5 = strlen(__s);
      builtin_strncpy(__s_00 + sVar5 + 0xcb0,"NOTE_FFOR ",0xb);
      uVar3 = kev->fflags;
    }
    if (0x3fffffff < uVar3) {
      sVar5 = strlen(__s);
      builtin_strncpy(__s_00 + sVar5 + 0xcb0,"NOTE_FFCOPY ",0xd);
      uVar3 = kev->fflags;
    }
    if ((uVar3 >> 0x18 & 1) != 0) {
      sVar5 = strlen(__s);
      builtin_strncpy(__s_00 + sVar5 + 0xcb0,"NOTE_TRIGGER ",0xe);
    }
    break;
  case -7:
    uVar3 = kev->fflags;
    if ((uVar3 & 1) != 0) {
      sVar5 = strlen(__s);
      builtin_strncpy(__s_00 + sVar5 + 0xcb0,"NOTE_SECONDS ",0xe);
      uVar3 = kev->fflags;
    }
    if ((uVar3 & 2) != 0) {
      sVar5 = strlen(__s);
      builtin_strncpy(__s_00 + sVar5 + 0xcb0,"NOTE_USECONDS ",0xf);
      uVar3 = kev->fflags;
    }
    if ((uVar3 & 4) != 0) {
      sVar5 = strlen(__s);
      builtin_strncpy(__s_00 + sVar5 + 0xcb0,"NOTE_NSECONDS ",0xf);
      uVar3 = kev->fflags;
    }
    if ((uVar3 & 8) != 0) {
      sVar5 = strlen(__s);
      builtin_strncpy(__s_00 + sVar5 + 0xcb0,"NOTE_ABSOLUTE ",0xf);
    }
    break;
  case -5:
    uVar3 = kev->fflags;
    if ((int)uVar3 < 0) {
      sVar5 = strlen(__s);
      builtin_strncpy(__s_00 + sVar5 + 0xcb0,"NOTE_EXIT ",0xb);
      uVar3 = kev->fflags;
    }
    if ((uVar3 >> 0x1e & 1) != 0) {
      sVar5 = strlen(__s);
      builtin_strncpy(__s_00 + sVar5 + 0xcb0,"NOTE_FORK ",0xb);
      uVar3 = kev->fflags;
    }
    if ((uVar3 >> 0x1d & 1) != 0) {
      sVar5 = strlen(__s);
      builtin_strncpy(__s_00 + sVar5 + 0xcb0,"NOTE_EXEC ",0xb);
    }
    break;
  case -4:
    uVar3 = kev->fflags;
    if ((uVar3 & 1) != 0) {
      sVar5 = strlen(__s);
      builtin_strncpy(__s_00 + sVar5 + 0xcb0,"NOTE_DELETE ",0xd);
      uVar3 = kev->fflags;
    }
    if ((uVar3 & 2) != 0) {
      sVar5 = strlen(__s);
      builtin_strncpy(__s_00 + sVar5 + 0xcb0,"NOTE_WRITE ",0xc);
      uVar3 = kev->fflags;
    }
    if ((uVar3 & 4) != 0) {
      sVar5 = strlen(__s);
      builtin_strncpy(__s_00 + sVar5 + 0xcb0,"NOTE_EXTEND ",0xd);
      uVar3 = kev->fflags;
    }
    if ((uVar3 & 8) != 0) {
      sVar5 = strlen(__s);
      builtin_strncpy(__s_00 + sVar5 + 0xcb0,"NOTE_ATTRIB ",0xd);
      uVar3 = kev->fflags;
    }
    if ((uVar3 & 0x10) != 0) {
      sVar5 = strlen(__s);
      builtin_strncpy(__s_00 + sVar5 + 0xcb0,"NOTE_LINK ",0xb);
      uVar3 = kev->fflags;
    }
    if ((uVar3 & 0x20) != 0) {
      sVar5 = strlen(__s);
      builtin_strncpy(__s_00 + sVar5 + 0xcb0,"NOTE_RENAME ",0xd);
    }
  }
  sVar5 = strlen(__s);
  if (__s[sVar5 - 1] == ' ') {
    __s_00[sVar5 + 0xcaf] = '\0';
  }
  sVar5 = strlen(__s);
  (__s + sVar5)[0] = ')';
  (__s + sVar5)[1] = '\0';
  snprintf(__s_00,0x863,"{ ident=%i, filter=%s, %s, %s, data=%d, udata=%p }",uVar2 & 0xffffffff,
           __s_00 + 0x870,pcVar4,__s,(ulong)(uint)kev->data,kev->udata);
  return __s_00;
}

Assistant:

const char *
kevent_dump(const struct kevent *kev)
{
    static __thread char buf[2147];

    snprintf((char *) buf, sizeof(buf),
            "{ ident=%i, filter=%s, %s, %s, data=%d, udata=%p }",
            (u_int) kev->ident,
            kevent_filter_dump(kev),
            kevent_flags_dump(kev),
            kevent_fflags_dump(kev),
            (int) kev->data,
            kev->udata);

    return ((const char *) buf);
}